

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_test.cpp
# Opt level: O0

void __thiscall
check_construction_of_landscape_form_gudhi_style_file::test_method
          (check_construction_of_landscape_form_gudhi_style_file *this)

{
  undefined8 uVar1;
  bool bVar2;
  unsigned_long number_of_levels;
  lazy_ostream *prev;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_c8;
  assertion_result local_a8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80 [2];
  undefined1 local_60 [8];
  Persistence_landscape q;
  Persistence_landscape p;
  check_construction_of_landscape_form_gudhi_style_file *this_local;
  
  number_of_levels = std::numeric_limits<unsigned_long>::max();
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)&q.number_of_functions_for_projections_to_reals,
             "data/persistence_file_with_four_entries_per_line",1,number_of_levels);
  Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
            ((Persistence_landscape *)local_60);
  Gudhi::Persistence_representations::Persistence_landscape::load_landscape_from_file
            ((Persistence_landscape *)local_60,
             "data/persistence_file_with_four_entries_per_line_landscape");
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_80,0x28,&local_90);
    bVar2 = Gudhi::Persistence_representations::Persistence_landscape::operator==
                      ((Persistence_landscape *)&q.number_of_functions_for_projections_to_reals,
                       (Persistence_landscape *)local_60);
    boost::test_tools::assertion_result::assertion_result(&local_a8,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_d8,"p == q",6);
    boost::unit_test::operator<<(&local_c8,prev,&local_d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_test.cpp"
               ,0x89);
    boost::test_tools::tt_detail::report_assertion(&local_a8,&local_c8,&local_e8,0x28,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_c8);
    boost::test_tools::assertion_result::~assertion_result(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)local_60);
  Gudhi::Persistence_representations::Persistence_landscape::~Persistence_landscape
            ((Persistence_landscape *)&q.number_of_functions_for_projections_to_reals);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape_form_gudhi_style_file) {
  Persistence_landscape p("data/persistence_file_with_four_entries_per_line", 1);
  // p.print_to_file("persistence_file_with_four_entries_per_line_landscape");
  Persistence_landscape q;
  q.load_landscape_from_file("data/persistence_file_with_four_entries_per_line_landscape");
  BOOST_CHECK(p == q);
}